

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi.cpp
# Opt level: O2

int adl_setNumChips(ADL_MIDIPlayer *device,int numChips)

{
  int iVar1;
  uint32_t uVar2;
  MIDIplay *play;
  OPL3 *this;
  bool bVar3;
  int iVar4;
  allocator local_39;
  string local_38;
  
  if (device == (ADL_MIDIPlayer *)0x0) {
    return -2;
  }
  play = (MIDIplay *)device->adl_midiPlayer;
  if (play == (MIDIplay *)0x0) {
    __assert_fail("play",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libADLMIDI/src/adlmidi.cpp"
                  ,0x86,"int adl_setNumChips(ADL_MIDIPlayer *, int)");
  }
  (play->m_setup).numChips = numChips;
  if (numChips - 0x65U < 0xffffff9c) {
    std::__cxx11::string::string
              ((string *)&local_38,"number of chips may only be 1..100.\n",&local_39);
    MIDIplay::setErrorString(play,&local_38);
    std::__cxx11::string::_M_dispose();
    return -1;
  }
  iVar4 = numChips * 6;
  iVar1 = (play->m_setup).numFourOps;
  if (iVar1 == iVar4 || SBORROW4(iVar1,iVar4) != iVar1 + numChips * -6 < 0) {
    if (-2 < iVar1) goto LAB_0012bb48;
    iVar4 = -1;
  }
  (play->m_setup).numFourOps = iVar4;
LAB_0012bb48:
  this = (play->m_synth).m_p;
  bVar3 = OPL3::setupLocked(this);
  if (!bVar3) {
    this->m_numChips = (play->m_setup).numChips;
    uVar2 = (play->m_setup).numFourOps;
    if ((int)uVar2 < 0) {
      adlCalculateFourOpChannels(play,true);
    }
    else {
      this->m_numFourOps = uVar2;
    }
    MIDIplay::partialReset(play);
  }
  return 0;
}

Assistant:

ADLMIDI_EXPORT int adl_setNumChips(ADL_MIDIPlayer *device, int numChips)
{
    if(device == NULL)
        return -2;

    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);

#ifdef ADLMIDI_ENABLE_HW_SERIAL
    if(play->m_setup.serial)
        numChips = 1;
#endif

#ifdef ADLMIDI_HW_OPL
    play->m_setup.numChips = numChips > 2 ? 1 : static_cast<unsigned int>(numChips);
#else
    play->m_setup.numChips = static_cast<unsigned int>(numChips);
#endif

    if((play->m_setup.numChips < 1) || (play->m_setup.numChips > ADL_MAX_CHIPS))
    {
        play->setErrorString("number of chips may only be 1.." ADL_MAX_CHIPS_STR ".\n");
        return -1;
    }

    int maxFourOps = static_cast<int>(play->m_setup.numChips * 6);

    if(play->m_setup.numFourOps > maxFourOps)
        play->m_setup.numFourOps = maxFourOps;
    else if(play->m_setup.numFourOps < -1)
        play->m_setup.numFourOps = -1;

    Synth &synth = *play->m_synth;
    if(!synth.setupLocked())
    {
        synth.m_numChips = play->m_setup.numChips;
        if(play->m_setup.numFourOps < 0)
            adlCalculateFourOpChannels(play, true);
        else
            synth.m_numFourOps = static_cast<uint32_t>(play->m_setup.numFourOps);
        play->partialReset();
        return 0;
    }

    return 0;
}